

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O0

void __thiscall
apngasm::APNGAsm::process_rect
          (APNGAsm *this,uchar *row,int rowbytes,int bpp,int stride,int h,uchar *rows)

{
  byte bVar1;
  uchar uVar2;
  uchar uVar3;
  uchar *puVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a0;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_7c;
  uchar *puStack_78;
  uint mins;
  uchar *best_row;
  uint sum;
  uchar *out;
  uchar *dp;
  uchar *prev;
  int p;
  int pc;
  int pb;
  int pa;
  int c;
  int b;
  int a;
  int v;
  int j;
  int i;
  int h_local;
  int stride_local;
  int bpp_local;
  int rowbytes_local;
  uchar *row_local;
  APNGAsm *this_local;
  
  dp = (uchar *)0x0;
  out = rows;
  a = 0;
  _bpp_local = row;
  do {
    if (h <= a) {
      return;
    }
    best_row._4_4_ = 0;
    puStack_78 = this->_row_buf;
    puVar4 = this->_row_buf;
    for (v = 0; uVar5 = best_row._4_4_, v < rowbytes; v = v + 1) {
      bVar1 = _bpp_local[v];
      puVar4[(long)v + 1] = bVar1;
      local_8c = (uint)bVar1;
      if (0x7f < local_8c) {
        local_8c = 0x100 - local_8c;
      }
      best_row._4_4_ = local_8c + best_row._4_4_;
    }
    local_7c = best_row._4_4_;
    best_row._4_4_ = 0;
    puVar4 = this->_sub_row;
    for (v = 0; iVar8 = bpp, v < bpp; v = v + 1) {
      bVar1 = _bpp_local[v];
      puVar4[(long)v + 1] = bVar1;
      local_90 = (uint)bVar1;
      if (0x7f < local_90) {
        local_90 = 0x100 - local_90;
      }
      best_row._4_4_ = local_90 + best_row._4_4_;
    }
    while (v = iVar8, v < rowbytes) {
      uVar2 = _bpp_local[v];
      uVar3 = _bpp_local[v - bpp];
      puVar4[(long)v + 1] = uVar2 - uVar3;
      local_94 = (uint)(byte)(uVar2 - uVar3);
      if (0x7f < local_94) {
        local_94 = 0x100 - local_94;
      }
      best_row._4_4_ = local_94 + best_row._4_4_;
      if (uVar5 < best_row._4_4_) break;
      iVar8 = v + 1;
    }
    if (best_row._4_4_ < uVar5) {
      local_7c = best_row._4_4_;
      puStack_78 = this->_sub_row;
    }
    if (dp != (uchar *)0x0) {
      best_row._4_4_ = 0;
      puVar4 = this->_up_row;
      for (v = 0; v < rowbytes; v = v + 1) {
        uVar2 = _bpp_local[v];
        uVar3 = dp[v];
        puVar4[(long)v + 1] = uVar2 - uVar3;
        local_98 = (uint)(byte)(uVar2 - uVar3);
        if (0x7f < local_98) {
          local_98 = 0x100 - local_98;
        }
        best_row._4_4_ = local_98 + best_row._4_4_;
        if (local_7c < best_row._4_4_) break;
      }
      if (best_row._4_4_ < local_7c) {
        local_7c = best_row._4_4_;
        puStack_78 = this->_up_row;
      }
      best_row._4_4_ = 0;
      puVar4 = this->_avg_row;
      for (v = 0; iVar8 = bpp, v < bpp; v = v + 1) {
        local_a0 = (uint)_bpp_local[v] - dp[v] / 2;
        puVar4[(long)v + 1] = (uchar)local_a0;
        local_a0 = local_a0 & 0xff;
        if (0x7f < local_a0) {
          local_a0 = 0x100 - local_a0;
        }
        best_row._4_4_ = local_a0 + best_row._4_4_;
      }
      while (v = iVar8, v < rowbytes) {
        local_a8 = (uint)_bpp_local[v] - ((uint)dp[v] + (uint)_bpp_local[v - bpp]) / 2;
        puVar4[(long)v + 1] = (uchar)local_a8;
        local_a8 = local_a8 & 0xff;
        if (0x7f < local_a8) {
          local_a8 = 0x100 - local_a8;
        }
        best_row._4_4_ = local_a8 + best_row._4_4_;
        if (local_7c < best_row._4_4_) break;
        iVar8 = v + 1;
      }
      if (best_row._4_4_ < local_7c) {
        local_7c = best_row._4_4_;
        puStack_78 = this->_avg_row;
      }
      best_row._4_4_ = 0;
      puVar4 = this->_paeth_row;
      for (v = 0; iVar8 = bpp, v < bpp; v = v + 1) {
        uVar2 = _bpp_local[v];
        uVar3 = dp[v];
        puVar4[(long)v + 1] = uVar2 - uVar3;
        local_ac = (uint)(byte)(uVar2 - uVar3);
        if (0x7f < local_ac) {
          local_ac = 0x100 - local_ac;
        }
        best_row._4_4_ = local_ac + best_row._4_4_;
      }
      while (v = iVar8, v < rowbytes) {
        local_b0 = (uint)_bpp_local[v - bpp];
        local_b4 = (uint)dp[v - bpp];
        iVar6 = dp[v] - local_b4;
        iVar7 = local_b0 - local_b4;
        iVar8 = iVar6;
        if (iVar6 < 1) {
          iVar8 = -iVar6;
        }
        iVar9 = iVar7;
        if (iVar7 < 1) {
          iVar9 = -iVar7;
        }
        iVar6 = iVar6 + iVar7;
        if (iVar6 < 1) {
          iVar6 = -iVar6;
        }
        if ((iVar9 < iVar8) || (iVar6 < iVar8)) {
          if (iVar9 <= iVar6) {
            local_b4 = (uint)dp[v];
          }
          local_b0 = local_b4;
        }
        bVar1 = _bpp_local[v];
        puVar4[(long)v + 1] = (uchar)(bVar1 - local_b0);
        local_b8 = bVar1 - local_b0 & 0xff;
        if (0x7f < local_b8) {
          local_b8 = 0x100 - local_b8;
        }
        best_row._4_4_ = local_b8 + best_row._4_4_;
        if (local_7c < best_row._4_4_) break;
        iVar8 = v + 1;
      }
      if (best_row._4_4_ < local_7c) {
        puStack_78 = this->_paeth_row;
      }
    }
    if (rows == (uchar *)0x0) {
      (this->_op_zstream1).next_in = this->_row_buf;
      (this->_op_zstream1).avail_in = rowbytes + 1;
      deflate(&this->_op_zstream1,0);
      (this->_op_zstream2).next_in = puStack_78;
      (this->_op_zstream2).avail_in = rowbytes + 1;
      deflate(&this->_op_zstream2);
    }
    else {
      memcpy(out,puStack_78,(long)(rowbytes + 1));
      out = out + (rowbytes + 1);
    }
    dp = _bpp_local;
    _bpp_local = _bpp_local + stride;
    a = a + 1;
  } while( true );
}

Assistant:

void APNGAsm::process_rect(unsigned char * row, int rowbytes, int bpp, int stride, int h, unsigned char * rows)
  {
    int i, j, v;
    int a, b, c, pa, pb, pc, p;
    unsigned char * prev = NULL;
    unsigned char * dp  = rows;
    unsigned char * out;

    for (j=0; j<h; j++)
    {
      unsigned int    sum = 0;
      unsigned char * best_row = _row_buf;
      unsigned int    mins = ((unsigned int)(-1)) >> 1;

      out = _row_buf+1;
      for (i=0; i<rowbytes; i++)
      {
        v = out[i] = row[i];
        sum += (v < 128) ? v : 256 - v;
      }
      mins = sum;

      sum = 0;
      out = _sub_row+1;
      for (i=0; i<bpp; i++)
      {
        v = out[i] = row[i];
        sum += (v < 128) ? v : 256 - v;
      }
      for (i=bpp; i<rowbytes; i++)
      {
        v = out[i] = row[i] - row[i-bpp];
        sum += (v < 128) ? v : 256 - v;
        if (sum > mins) break;
      }
      if (sum < mins)
      {
        mins = sum;
        best_row = _sub_row;
      }

      if (prev)
      {
        sum = 0;
        out = _up_row+1;
        for (i=0; i<rowbytes; i++)
        {
          v = out[i] = row[i] - prev[i];
          sum += (v < 128) ? v : 256 - v;
          if (sum > mins) break;
        }
        if (sum < mins)
        {
          mins = sum;
          best_row = _up_row;
        }

        sum = 0;
        out = _avg_row+1;
        for (i=0; i<bpp; i++)
        {
          v = out[i] = row[i] - prev[i]/2;
          sum += (v < 128) ? v : 256 - v;
        }
        for (i=bpp; i<rowbytes; i++)
        {
          v = out[i] = row[i] - (prev[i] + row[i-bpp])/2;
          sum += (v < 128) ? v : 256 - v;
          if (sum > mins) break;
        }
        if (sum < mins)
        {
          mins = sum;
          best_row = _avg_row;
        }

        sum = 0;
        out = _paeth_row+1;
        for (i=0; i<bpp; i++)
        {
          v = out[i] = row[i] - prev[i];
          sum += (v < 128) ? v : 256 - v;
        }
        for (i=bpp; i<rowbytes; i++)
        {
          a = row[i-bpp];
          b = prev[i];
          c = prev[i-bpp];
          p = b - c;
          pc = a - c;
          pa = abs(p);
          pb = abs(pc);
          pc = abs(p + pc);
          p = (pa <= pb && pa <=pc) ? a : (pb <= pc) ? b : c;
          v = out[i] = row[i] - p;
          sum += (v < 128) ? v : 256 - v;
          if (sum > mins) break;
        }
        if (sum < mins)
        {
          best_row = _paeth_row;
        }
      }

      if (rows == NULL)
      {
        // deflate_rect_op()
        _op_zstream1.next_in = _row_buf;
        _op_zstream1.avail_in = rowbytes + 1;
        deflate(&_op_zstream1, Z_NO_FLUSH);

        _op_zstream2.next_in = best_row;
        _op_zstream2.avail_in = rowbytes + 1;
        deflate(&_op_zstream2, Z_NO_FLUSH);
      }
      else
      {
        // deflate_rect_fin()
        memcpy(dp, best_row, rowbytes+1);
        dp += rowbytes+1;
      }

      prev = row;
      row += stride;
    }
  }